

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

string * Potassco::xconvert(string *out,unsigned_long_long n)

{
  anon_union_64_3_812e3e79_for_StringBuilder_0 local_50;
  
  if (n == 0xffffffffffffffff) {
    out = (string *)std::__cxx11::string::append((char *)out);
  }
  else {
    local_50.sbo_[0x3f] = '@';
    local_50.str_ = out;
    StringBuilder::append_((StringBuilder *)&local_50.buf_,n,true);
    StringBuilder::~StringBuilder((StringBuilder *)&local_50.buf_);
  }
  return out;
}

Assistant:

string& xconvert(string& out, unsigned long long n) {
	return n != static_cast<unsigned long long>(-1)
		? (StringBuilder(out).append(n), out)
		: out.append("umax");
}